

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSqueezeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  int64_t iVar5;
  iterator iVar6;
  Type *pTVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  undefined1 *puVar9;
  Result *_result;
  int iVar10;
  int index;
  undefined1 *puVar11;
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  int a;
  undefined4 uStack_a4;
  int *piStack_a0;
  pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int local_64;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
  uVar4 = layer->_oneof_case_[0];
  puVar11 = *(undefined1 **)&layer->layer_;
  puVar9 = puVar11;
  if (uVar4 != 0x460) {
    puVar9 = Specification::_SqueezeLayerParams_default_instance_;
  }
  if (((SqueezeLayerParams *)puVar9)->squeezeall_ == false) {
    if ((((ConvolutionLayerParams *)puVar9)->kernelsize_).current_size_ == 0) {
      std::__cxx11::string::string
                ((string *)&local_c8,
                 (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&err_1,"Squeeze Layer \'",&local_c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&axes_set,
                     &err_1,"\': length of the \'axes\' parameter cannot be 0.");
      std::__cxx11::string::~string((string *)&err_1);
      std::__cxx11::string::~string((string *)&local_c8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&axes_set);
      std::__cxx11::string::~string((string *)&axes_set);
      return __return_storage_ptr__;
    }
    p_Var1 = &axes_set._M_t._M_impl.super__Rb_tree_header;
    axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar10 = 0;
    axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    while( true ) {
      if (uVar4 != 0x460) {
        puVar11 = Specification::_SqueezeLayerParams_default_instance_;
      }
      if ((((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_ <= iVar10) {
        if (((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) ||
           ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) goto LAB_002b08ba;
        pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                           (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
        uVar2 = pTVar7->rank_;
        pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                           (&(layer->outputtensor_).super_RepeatedPtrFieldBase,0);
        if (layer->_oneof_case_[0] == 0x460) {
          puVar11 = *(undefined1 **)&layer->layer_;
        }
        else {
          puVar11 = Specification::_SqueezeLayerParams_default_instance_;
        }
        iVar10 = (((ConvolutionLayerParams *)puVar11)->kernelsize_).current_size_;
        if ((uVar2 != 1) && (pTVar7->rank_ + iVar10 != uVar2)) {
          std::__cxx11::string::string
                    ((string *)&local_88,
                     (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          std::operator+(&local_c8,"Squeeze Layer \'",&local_88);
          std::operator+(&err_1,&local_c8,
                         "\': output rank plus the length of the axes parameter must equal input rank."
                        );
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_88);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
          goto LAB_002b07d5;
        }
        local_98 = (pointer)0x0;
        _a = (pointer)0x0;
        piStack_a0 = (int *)0x0;
        index = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        goto LAB_002b0820;
      }
      iVar5 = Specification::SqueezeLayerParams::_internal_axes
                        ((SqueezeLayerParams *)puVar11,iVar10);
      _a = (pointer)CONCAT44(uStack_a4,(int)iVar5);
      iVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &axes_set,&a);
      if ((_Rb_tree_header *)iVar6._M_node != p_Var1) break;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &axes_set,&a);
      iVar10 = iVar10 + 1;
      uVar4 = layer->_oneof_case_[0];
      puVar11 = *(undefined1 **)&layer->layer_;
    }
    std::__cxx11::string::string
              ((string *)&local_88,
               (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_c8,"Squeeze Layer \'",&local_88);
    std::operator+(&err_1,&local_c8,"\': all the values in the \'axes\' parameter must be unique.");
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_88);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
LAB_002b07d5:
    std::__cxx11::string::~string((string *)&err_1);
    goto LAB_002b07dd;
  }
LAB_002b059d:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
LAB_002b0820:
  if (iVar10 == index) goto LAB_002b0882;
  puVar11 = Specification::_SqueezeLayerParams_default_instance_;
  if (layer->_oneof_case_[0] == 0x460) {
    puVar11 = *(undefined1 **)&layer->layer_;
  }
  iVar5 = Specification::SqueezeLayerParams::_internal_axes((SqueezeLayerParams *)puVar11,index);
  local_64 = ((int)iVar5 >> 0x1f & uVar2) + (int)iVar5;
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    (_a,piStack_a0,&local_64);
  if (_Var8._M_current != piStack_a0) {
    std::__cxx11::string::string
              ((string *)&local_88,
               (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_c8,"Squeeze Layer \'",&local_88);
    std::operator+(&err_1,&local_c8,
                   "\': axes parameter list cannot have the same value more than once.");
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_88);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
    goto LAB_002b098a;
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)&a,&local_64);
  index = index + 1;
  goto LAB_002b0820;
LAB_002b0882:
  _Var8 = std::
          __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (_a,piStack_a0);
  iVar10 = *_Var8._M_current;
  _Var8 = std::
          __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (_a,piStack_a0);
  if (((int)uVar2 <= iVar10) || (*_Var8._M_current < 0)) {
    std::__cxx11::string::string
              ((string *)&local_88,
               (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_c8,"Squeeze Layer \'",&local_88);
    std::operator+(&err_1,&local_c8,"\': axes refers to a dimension that exceeds the input rank.");
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_88);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
LAB_002b098a:
    std::__cxx11::string::~string((string *)&err_1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&a);
LAB_002b07dd:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&axes_set._M_t);
    return __return_storage_ptr__;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&a);
LAB_002b08ba:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&axes_set._M_t);
  goto LAB_002b059d;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSqueezeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (!layer.squeeze().squeezeall()) {

        if (layer.squeeze().axes_size() == 0) {
            std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        // either all values in axes must be positive or all negative
        std::set<int> axes_set;
        for (int i=0; i<layer.squeeze().axes_size(); i++) {
            int a = (int)layer.squeeze().axes(i);
            if (axes_set.find(a) != axes_set.end()) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            } else {
                axes_set.insert(a);
            }
        }

        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            int input_rank = static_cast<int>(layer.inputtensor(0).rank());
            int output_rank = static_cast<int>(layer.outputtensor(0).rank());
            int axes_length = layer.squeeze().axes_size();

            if (input_rank != 1) {
                if (output_rank + axes_length != input_rank) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': output rank plus the length of the axes parameter must equal input rank.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }

            std::vector<int> axes;
            for (int i=0; i<axes_length; i++) {
                int a = (int)layer.squeeze().axes(i);
                if (a < 0) {
                    a = input_rank + a;
                }
                if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                axes.push_back(a);
            }

            int max_value = *std::max_element(axes.begin(), axes.end());
            int min_value = *std::min_element(axes.begin(), axes.end());
            if (max_value > input_rank - 1 || min_value < 0) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the input rank.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return Result();
}